

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O0

bool __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
::
_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>>>
          (List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
           *this,set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                 *column)

{
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
  *this_00;
  bool bVar1;
  ID_index rowIndex;
  size_type __new_size;
  iterator local_60;
  reference local_58;
  Entry *entry;
  iterator __end0;
  iterator __begin0;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
  *__range4;
  iterator it;
  _Self local_28;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
  *local_20;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
  *column_local;
  List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  *this_local;
  
  local_20 = column;
  column_local = (set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                  *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
       ::begin(column);
  it._M_node = (_List_node_base *)
               std::
               set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
               ::end(local_20);
  bVar1 = std::operator==(&local_28,(_Self *)&it);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = std::__cxx11::
            list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
            ::empty((list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                     *)(this + 0x10));
    if (bVar1) {
      __new_size = std::
                   set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                   ::size(local_20);
      std::__cxx11::
      list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
      ::resize((list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                *)(this + 0x10),__new_size);
      __range4 = (set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                  *)std::__cxx11::
                    list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                    ::begin((list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                             *)(this + 0x10));
      this_00 = local_20;
      __end0 = std::
               set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
               ::begin(local_20);
      entry = (Entry *)std::
                       set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                       ::end(this_00);
      while( true ) {
        bVar1 = std::operator!=(&__end0,(_Self *)&entry);
        if (!bVar1) break;
        local_58 = std::
                   _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>
                   ::operator*(&__end0);
        rowIndex = Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
                   ::get_row_index(local_58);
        local_60._M_node =
             (_List_node_base *)
             std::
             _List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>
             ::operator++((_List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>
                           *)&__range4,0);
        List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
        ::_update_entry((List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
                         *)this,rowIndex,&local_60);
        std::
        _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>
        ::operator++(&__end0);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ =
           _add_to_column<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>>>
                     (local_20,(List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
                                *)this);
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool List_column<Master_matrix>::_add(const Entry_range& column)
{
  if (column.begin() == column.end()) return false;
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    auto it = column_.begin();
    for (const Entry& entry : column) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        _update_entry(entry.get_row_index(), it++);
      } else {
        _update_entry(entry.get_element(), entry.get_row_index(), it++);
      }
    }
    return true;
  }

  return _add_to_column(column, *this);
}